

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function_relation.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::TableFunctionRelation::GetTableRef(TableFunctionRelation *this)

{
  shared_ptr<duckdb::Relation,_true> *this_00;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  Value *pVVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var5;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> _Var6;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var7;
  pointer pSVar8;
  Relation *pRVar9;
  pointer pSVar10;
  pointer pTVar11;
  Value *args;
  long in_RSI;
  long *plVar12;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_80;
  _Head_base<0UL,_duckdb::SubqueryExpression_*,_false> local_78;
  long local_70;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_68;
  ParsedExpression *local_60;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_58;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_38;
  
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70 = in_RSI;
  if (*(long *)(in_RSI + 0xf0) != 0) {
    make_uniq<duckdb::SubqueryExpression>();
    make_uniq<duckdb::SelectStatement>();
    pSVar8 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
             ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                           *)&local_78);
    _Var5._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (SelectStatement *)0x0;
    this_00 = (shared_ptr<duckdb::Relation,_true> *)(local_70 + 0xf0);
    _Var1._M_head_impl =
         (pSVar8->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar8->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var5._M_head_impl;
    if (_Var1._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_SQLStatement + 8))();
      if (local_80._M_head_impl != (SelectStatement *)0x0) {
        (*((local_80._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
    }
    pRVar9 = shared_ptr<duckdb::Relation,_true>::operator->(this_00);
    (*pRVar9->_vptr_Relation[3])(&local_80,pRVar9);
    pSVar8 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
             ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                           *)&local_78);
    pSVar10 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->(&pSVar8->subquery);
    _Var1._M_head_impl = local_80._M_head_impl;
    local_80._M_head_impl = (SelectStatement *)0x0;
    _Var2._M_head_impl =
         (pSVar10->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar10->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)_Var1._M_head_impl
    ;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
      if (local_80._M_head_impl != (SelectStatement *)0x0) {
        (*((local_80._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
    }
    pSVar8 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
             ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                           *)&local_78);
    local_80._M_head_impl = (SelectStatement *)local_78._M_head_impl;
    pSVar8->subquery_type = SCALAR;
    local_78._M_head_impl = (SubqueryExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_58,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_80);
    if (local_80._M_head_impl != (SelectStatement *)0x0) {
      (*((local_80._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    if ((SelectStatement *)local_78._M_head_impl != (SelectStatement *)0x0) {
      (*((SQLStatement *)&(local_78._M_head_impl)->super_ParsedExpression)->_vptr_SQLStatement[1])()
      ;
    }
  }
  pVVar3 = *(Value **)(local_70 + 0x90);
  for (args = *(Value **)(local_70 + 0x88); args != pVVar3; args = args + 1) {
    make_uniq<duckdb::ConstantExpression,duckdb::Value&>((duckdb *)&local_80,args);
    local_78._M_head_impl = (SubqueryExpression *)local_80._M_head_impl;
    local_80._M_head_impl = (SelectStatement *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_58,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_78);
    if ((SelectStatement *)local_78._M_head_impl != (SelectStatement *)0x0) {
      (*((SQLStatement *)&(local_78._M_head_impl)->super_ParsedExpression)->_vptr_SQLStatement[1])()
      ;
    }
    local_78._M_head_impl = (SubqueryExpression *)0x0;
    if (local_80._M_head_impl != (SelectStatement *)0x0) {
      (*((local_80._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
  }
  plVar12 = (long *)(local_70 + 0xb0);
  local_38._M_head_impl = (TableRef *)this;
  while (plVar12 = (long *)*plVar12, plVar12 != (long *)0x0) {
    make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string_const&>
              ((duckdb *)&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar12 + 1));
    make_uniq<duckdb::ConstantExpression,duckdb::Value&>((duckdb *)&local_80,(Value *)(plVar12 + 5))
    ;
    local_68._M_head_impl._0_1_ = 0x19;
    make_uniq<duckdb::ComparisonExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ColumnRefExpression,std::default_delete<duckdb::ColumnRefExpression>,true>,duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
              ((duckdb *)&local_60,(ExpressionType *)&local_68,
               (unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                *)&local_78,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                *)&local_80);
    local_68._M_head_impl = local_60;
    local_60 = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_58,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_68);
    if (local_68._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_68._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_60 != (ParsedExpression *)0x0) {
      (*(local_60->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_80._M_head_impl != (SelectStatement *)0x0) {
      (*((local_80._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
    if ((SelectStatement *)local_78._M_head_impl != (SelectStatement *)0x0) {
      (*((SQLStatement *)&(local_78._M_head_impl)->super_ParsedExpression)->_vptr_SQLStatement[1])()
      ;
    }
  }
  make_uniq<duckdb::TableFunctionRef>();
  make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            ((duckdb *)&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_70 + 0x68),
             (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              *)&local_58);
  _Var7._M_head_impl = local_38._M_head_impl;
  _Var1._M_head_impl = local_80._M_head_impl;
  local_80._M_head_impl = (SelectStatement *)0x0;
  pTVar11 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
            ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                          *)&local_78);
  _Var4._M_head_impl =
       (pTVar11->function).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (pTVar11->function).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (ParsedExpression *)_Var1._M_head_impl;
  if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
  }
  _Var6._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SubqueryExpression *)0x0;
  (_Var7._M_head_impl)->_vptr_TableRef = (_func_int **)_Var6._M_head_impl;
  if (local_80._M_head_impl != (SelectStatement *)0x0) {
    (*((local_80._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    if (local_78._M_head_impl != (SubqueryExpression *)0x0) {
      (*((local_78._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
    }
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector(&local_58);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)_Var7._M_head_impl;
}

Assistant:

unique_ptr<TableRef> TableFunctionRelation::GetTableRef() {
	vector<unique_ptr<ParsedExpression>> children;
	if (input_relation) { // input relation becomes first parameter if present, always
		auto subquery = make_uniq<SubqueryExpression>();
		subquery->subquery = make_uniq<SelectStatement>();
		subquery->subquery->node = input_relation->GetQueryNode();
		subquery->subquery_type = SubqueryType::SCALAR;
		children.push_back(std::move(subquery));
	}
	for (auto &parameter : parameters) {
		children.push_back(make_uniq<ConstantExpression>(parameter));
	}

	for (auto &parameter : named_parameters) {
		// Hackity-hack some comparisons with column refs
		// This is all but pretty, basically the named parameter is the column, the table is empty because that's what
		// the function binder likes
		auto column_ref = make_uniq<ColumnRefExpression>(parameter.first);
		auto constant_value = make_uniq<ConstantExpression>(parameter.second);
		auto comparison = make_uniq<ComparisonExpression>(ExpressionType::COMPARE_EQUAL, std::move(column_ref),
		                                                  std::move(constant_value));
		children.push_back(std::move(comparison));
	}

	auto table_function = make_uniq<TableFunctionRef>();
	auto function = make_uniq<FunctionExpression>(name, std::move(children));
	table_function->function = std::move(function);
	return std::move(table_function);
}